

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall r_exec::View::reset(View *this)

{
  View *this_local;
  
  reset_ctrl_values(this);
  reset_init_sln(this);
  reset_init_act(this);
  return;
}

Assistant:

void View::reset()
{
    reset_ctrl_values();
    reset_init_sln();
    reset_init_act();
}